

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

void __thiscall
amrex::TagBox::get_itags(TagBox *this,Vector<int,_std::allocator<int>_> *ar,Box *tilebx)

{
  Box *this_00;
  int iVar1;
  char *pcVar2;
  int idim;
  int iVar3;
  long lVar4;
  pointer piVar5;
  char *pcVar6;
  long lVar7;
  size_type __new_size;
  long lVar8;
  long lVar9;
  long lVar10;
  int k;
  IntVect IVar11;
  int Ltb [3];
  int Lbx [3];
  int local_58 [3];
  Long stride [3];
  
  this_00 = &(this->super_BaseFab<char>).domain;
  IVar11 = Box::length(this_00);
  local_58[0] = IVar11.vect[0];
  local_58[1] = IVar11.vect[1];
  local_58[2] = IVar11.vect[2];
  Lbx[0] = 1;
  Lbx[1] = 1;
  Lbx[2] = 1;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    Lbx[lVar4] = local_58[lVar4];
  }
  stride[0] = 1;
  lVar9 = (long)Lbx[0];
  stride[1] = lVar9;
  lVar7 = (long)Lbx[1];
  stride[2] = lVar7 * lVar9;
  Ltb[0] = 1;
  Ltb[1] = 1;
  Ltb[2] = 1;
  __new_size = 1;
  lVar10 = 0;
  for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
    iVar1 = *(int *)((long)(tilebx->smallend).vect + lVar4);
    iVar3 = (*(int *)((long)(tilebx->bigend).vect + lVar4) - iVar1) + 1;
    *(int *)((long)Ltb + lVar4) = iVar3;
    __new_size = __new_size * (long)iVar3;
    lVar10 = lVar10 + ((long)iVar1 - (long)*(int *)((long)(this_00->smallend).vect + lVar4)) *
                      *(long *)((long)stride + lVar4 * 2);
  }
  if ((long)(ar->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      - (long)(ar->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      >> 2 < (long)__new_size) {
    std::vector<int,_std::allocator<int>_>::resize
              (&ar->super_vector<int,_std::allocator<int>_>,__new_size);
  }
  pcVar2 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  pcVar2 = pcVar2 + lVar10;
  piVar5 = (ar->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 < Ltb[2]; lVar4 = lVar4 + 1) {
    pcVar6 = pcVar2;
    for (lVar10 = 0; lVar10 < Ltb[1]; lVar10 = lVar10 + 1) {
      for (lVar8 = 0; (int)lVar8 < Ltb[0]; lVar8 = lVar8 + 1) {
        *piVar5 = (int)pcVar6[lVar8];
        piVar5 = piVar5 + 1;
      }
      pcVar6 = pcVar6 + lVar9;
    }
    pcVar2 = pcVar2 + lVar7 * lVar9;
  }
  return;
}

Assistant:

void
TagBox::get_itags(Vector<int>& ar, const Box& tilebx) const noexcept
{
    auto dlen = length();
    int Lbx[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Lbx[idim] = dlen[idim];
    }

    Long stride[] = {1, Lbx[0], Long(Lbx[0])*Long(Lbx[1])};

    Long Ntb = 1, stb=0;
    int Ltb[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Ltb[idim] = tilebx.length(idim);
        Ntb *= Ltb[idim];
        stb += stride[idim] * (tilebx.smallEnd(idim) - domain.smallEnd(idim));
    }

    if (ar.size() < Ntb) ar.resize(Ntb);

    const TagType* const p0   = dataPtr() + stb;  // +stb to the lower corner of tilebox
    int*                 iptr = ar.dataPtr();

    for (int k=0; k<Ltb[2]; k++) {
        for (int j=0; j<Ltb[1]; j++) {
            const TagType* cptr = p0 + j*stride[1] + k*stride[2];
            for (int i=0; i<Ltb[0]; i++, cptr++, iptr++) {
                if (*cptr) {
                    *iptr = *cptr;
                }
                else {
                    *iptr = TagBox::CLEAR;
                }
            }
        }
    }
}